

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::ProcessLazyBailOut(LinearScan *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  BailOutInfo *pBVar5;
  
  bVar2 = IR::Instr::HasLazyBailOut(instr);
  if (!bVar2) {
    return;
  }
  BVar3 = Func::HasTry(this->func);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x1333,"(!this->func->HasTry())","!this->func->HasTry()");
    if (!bVar2) goto LAB_00586a18;
    *puVar4 = 0;
  }
  Func::EnsureLazyBailOutRecordSlot(this->func);
  pBVar5 = IR::Instr::GetBailOutInfo(instr);
  bVar2 = BailOutInfo::NeedsToRestoreUseOfDst(pBVar5);
  if (bVar2) {
    bVar2 = IR::Instr::OnlyHasLazyBailOut(instr);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x1339,"(instr->OnlyHasLazyBailOut())","instr->OnlyHasLazyBailOut()");
      if (!bVar2) {
LAB_00586a18:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    pBVar5 = IR::Instr::GetBailOutInfo(instr);
    BailOutInfo::RestoreUseOfDst(pBVar5);
  }
  FillBailOutRecord(this,instr);
  return;
}

Assistant:

void
LinearScan::ProcessLazyBailOut(IR::Instr *instr)
{
    if (instr->HasLazyBailOut())
    {
        // No lazy bailout for function with try/catch for now
        Assert(!this->func->HasTry());

        this->func->EnsureLazyBailOutRecordSlot();

        if (instr->GetBailOutInfo()->NeedsToRestoreUseOfDst())
        {
            Assert(instr->OnlyHasLazyBailOut());
            instr->GetBailOutInfo()->RestoreUseOfDst();
        }

        // FillBailOutRecord on lazy bailout must be called after KillImplicitRegs
        //
        // s1(rax) = ...
        // s2 = call s1(rax)
        // ...
        // use of s1
        //
        // s1 in this case needs to be spilled due to the call.
        // If we fill the bailout record similarly to normal bailouts,
        // we wouldn't have the correct value of s1 because rax would have already
        // been replaced by the result of the call.
        // Therefore we have to capture the value of it after the call and after KillImplicitRegs.
        this->FillBailOutRecord(instr);
    }
}